

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMLSParserImpl::startElement
          (DOMLSParserImpl *this,XMLElementDecl *elemDecl,uint urlId,XMLCh *elemPrefix,
          RefVectorOf<xercesc_4_0::XMLAttr> *attrList,XMLSize_t attrCount,bool isEmpty,bool isRoot)

{
  bool bVar1;
  FilterAction *pFVar2;
  ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher> *this_00;
  DOMLSException *this_01;
  FilterAction local_50 [2];
  FilterAction action;
  DOMNode *origParent;
  bool isRoot_local;
  XMLSize_t XStack_38;
  bool isEmpty_local;
  XMLSize_t attrCount_local;
  RefVectorOf<xercesc_4_0::XMLAttr> *attrList_local;
  XMLCh *elemPrefix_local;
  XMLElementDecl *pXStack_18;
  uint urlId_local;
  XMLElementDecl *elemDecl_local;
  DOMLSParserImpl *this_local;
  
  origParent._7_1_ = isEmpty;
  origParent._6_1_ = isRoot;
  XStack_38 = attrCount;
  attrCount_local = (XMLSize_t)attrList;
  attrList_local = (RefVectorOf<xercesc_4_0::XMLAttr> *)elemPrefix;
  elemPrefix_local._4_4_ = urlId;
  pXStack_18 = elemDecl;
  elemDecl_local = (XMLElementDecl *)this;
  if (((this->fFilter != (DOMLSParserFilter *)0x0) &&
      (this->fFilterDelayedTextNodes != (ValueHashTableOf<bool,_xercesc_4_0::PtrHasher> *)0x0)) &&
     (bVar1 = ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::containsKey
                        (this->fFilterDelayedTextNodes,(this->super_AbstractDOMParser).fCurrentNode)
     , bVar1)) {
    ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::removeKey
              (this->fFilterDelayedTextNodes,(this->super_AbstractDOMParser).fCurrentNode);
    applyFilter(this,(this->super_AbstractDOMParser).fCurrentNode);
  }
  _action = (this->super_AbstractDOMParser).fCurrentParent;
  AbstractDOMParser::startElement
            (&this->super_AbstractDOMParser,pXStack_18,elemPrefix_local._4_4_,
             (XMLCh *)attrList_local,(RefVectorOf<xercesc_4_0::XMLAttr> *)attrCount_local,XStack_38,
             false,(bool)(origParent._6_1_ & 1));
  if (this->fFilter != (DOMLSParserFilter *)0x0) {
    if (((this->fFilterAction ==
          (ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher> *)
          0x0) || (bVar1 = ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>
                           ::containsKey(this->fFilterAction,_action), !bVar1)) ||
       (pFVar2 = ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>
                 ::get(this->fFilterAction,_action,XMLPlatformUtils::fgMemoryManager),
       *pFVar2 != FILTER_REJECT)) {
      local_50[0] = (*this->fFilter->_vptr_DOMLSParserFilter[3])
                              (this->fFilter,(this->super_AbstractDOMParser).fCurrentNode);
      if (local_50[0] != FILTER_ACCEPT) {
        if (local_50[0] - FILTER_REJECT < 2) {
          if (this->fFilterAction ==
              (ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>
               *)0x0) {
            this_00 = (ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>
                       *)XMemory::operator_new(0x30,(this->super_AbstractDOMParser).fMemoryManager);
            ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>::
            ValueHashTableOf(this_00,7,(this->super_AbstractDOMParser).fMemoryManager);
            this->fFilterAction = this_00;
          }
          ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>::
          put(this->fFilterAction,(this->super_AbstractDOMParser).fCurrentNode,local_50);
        }
        else if (local_50[0] == FILTER_INTERRUPT) {
          this_01 = (DOMLSException *)__cxa_allocate_exception(0x28);
          DOMLSException::DOMLSException
                    (this_01,0x51,0x22,(this->super_AbstractDOMParser).fMemoryManager);
          __cxa_throw(this_01,&DOMLSException::typeinfo,DOMLSException::~DOMLSException);
        }
      }
    }
    else {
      local_50[1] = 2;
      ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>::put
                (this->fFilterAction,(this->super_AbstractDOMParser).fCurrentNode,local_50 + 1);
    }
  }
  if ((origParent._7_1_ & 1) != 0) {
    (*(this->super_AbstractDOMParser).super_XMLDocumentHandler._vptr_XMLDocumentHandler[6])
              (this,pXStack_18,(ulong)elemPrefix_local._4_4_,(ulong)(origParent._6_1_ & 1),
               attrList_local);
  }
  return;
}

Assistant:

void DOMLSParserImpl::startElement(const XMLElementDecl&         elemDecl
                                 , const unsigned int            urlId
                                 , const XMLCh* const            elemPrefix
                                 , const RefVectorOf<XMLAttr>&   attrList
                                 , const XMLSize_t               attrCount
                                 , const bool                    isEmpty
                                 , const bool                    isRoot)
{
    if(fFilter)
    {
        // send the notification for the previous text node
        if(fFilterDelayedTextNodes && fFilterDelayedTextNodes->containsKey(fCurrentNode))
        {
            fFilterDelayedTextNodes->removeKey(fCurrentNode);
            applyFilter(fCurrentNode);
        }
    }

    DOMNode* origParent = fCurrentParent;
    AbstractDOMParser::startElement(elemDecl, urlId, elemPrefix, attrList, attrCount, false, isRoot);
    if(fFilter)
    {
        // if the parent was already rejected, reject this too
        if(fFilterAction && fFilterAction->containsKey(origParent) && fFilterAction->get(origParent)==DOMLSParserFilter::FILTER_REJECT)
            fFilterAction->put(fCurrentNode, DOMLSParserFilter::FILTER_REJECT);
        else
        {
            DOMLSParserFilter::FilterAction action = fFilter->startElement((DOMElement*)fCurrentNode);

            switch(action)
            {
            case DOMLSParserFilter::FILTER_ACCEPT:      break;
            case DOMLSParserFilter::FILTER_REJECT:
            case DOMLSParserFilter::FILTER_SKIP:        if(fFilterAction==0)
                                                            fFilterAction=new (fMemoryManager) ValueHashTableOf<DOMLSParserFilter::FilterAction, PtrHasher>(7, fMemoryManager);
                                                        fFilterAction->put(fCurrentNode, action);
                                                        break;
            case DOMLSParserFilter::FILTER_INTERRUPT:   throw DOMLSException(DOMLSException::PARSE_ERR, XMLDOMMsg::LSParser_ParsingAborted, fMemoryManager);
            }
        }
    }
    if(isEmpty)
        endElement(elemDecl, urlId, isRoot, elemPrefix);
}